

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

bool google::protobuf::compiler::js::anon_unknown_0::HasExtensions(Descriptor *desc)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = -1;
  lVar3 = 0;
  do {
    lVar4 = lVar4 + 1;
    if (*(int *)(desc + 0x7c) <= lVar4) {
      lVar4 = -1;
      lVar3 = 0;
      do {
        lVar2 = (long)*(int *)(desc + 0x70);
        lVar4 = lVar4 + 1;
        if (lVar2 <= lVar4) {
          return lVar4 < lVar2;
        }
        bVar1 = HasExtensions((Descriptor *)(lVar3 + *(long *)(desc + 0x38)));
        lVar3 = lVar3 + 0x88;
      } while (!bVar1);
      return lVar4 < lVar2;
    }
    bVar1 = ShouldGenerateExtension((FieldDescriptor *)(lVar3 + *(long *)(desc + 0x50)));
    lVar3 = lVar3 + 0x48;
  } while (!bVar1);
  return true;
}

Assistant:

bool HasExtensions(const Descriptor* desc) {
  for (int i = 0; i < desc->extension_count(); i++) {
    if (ShouldGenerateExtension(desc->extension(i))) {
      return true;
    }
  }
  for (int i = 0; i < desc->nested_type_count(); i++) {
    if (HasExtensions(desc->nested_type(i))) {
      return true;
    }
  }
  return false;
}